

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_server.cpp
# Opt level: O2

int main(void)

{
  uint __fd;
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  FILE *pFVar5;
  char *__format;
  undefined8 uStack_90;
  sockaddr local_80;
  Conn conn;
  
  __fd = socket(2,1,0);
  pFVar5 = _stderr;
  if ((int)__fd < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    __format = "%s(%d)-<%s>: create socket failed! err: %s\n";
    uStack_90 = 0x12;
  }
  else {
    uVar1 = fcntl(__fd,3,0);
    fcntl(__fd,4,(ulong)(uVar1 | 0x800));
    local_80.sa_data[6] = '\0';
    local_80.sa_data[7] = '\0';
    local_80.sa_data[8] = '\0';
    local_80.sa_data[9] = '\0';
    local_80.sa_data[10] = '\0';
    local_80.sa_data[0xb] = '\0';
    local_80.sa_data[0xc] = '\0';
    local_80.sa_data[0xd] = '\0';
    local_80.sa_family = 2;
    local_80.sa_data[0] = '#';
    local_80.sa_data[1] = -0x7e;
    local_80.sa_data[2] = '\0';
    local_80.sa_data[3] = '\0';
    local_80.sa_data[4] = '\0';
    local_80.sa_data[5] = '\0';
    iVar2 = bind(__fd,&local_80,0x10);
    pFVar5 = _stderr;
    if (iVar2 == 0) {
      iVar2 = listen(__fd,0x400);
      pFVar5 = _stderr;
      if (iVar2 == 0) {
        conn._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &conn._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_header;
        conn._epoll._vptr_Epoll = (_func_int **)&PTR__Epoll_00106da0;
        conn._epoll._maxevents = -1;
        conn._epoll._epfd = -1;
        conn._epoll._events = (epoll_event *)0x0;
        conn._listen_fd = -1;
        conn._cur_conn_size = 0;
        conn._max_conn_size = 0;
        conn._conn_info_map._M_t._M_impl._0_8_ = 0;
        conn._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        conn._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        conn._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        conn._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        conn._cur_handler = 0;
        conn._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             conn._conn_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Conn::init(&conn,(EVP_PKEY_CTX *)(ulong)__fd);
        Conn::run(&conn);
        close(__fd);
        pFVar5 = _stderr;
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(pFVar5,"%s(%d)-<%s>: server exit, status: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/epoll_server.cpp"
                ,0x30,"main",pcVar4);
        fflush(_stderr);
        Conn::~Conn(&conn);
        return 0;
      }
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      __format = "%s(%d)-<%s>: listen sock failed! err: %s\n";
      uStack_90 = 0x27;
    }
    else {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      __format = "%s(%d)-<%s>: bind sock failed, err: %s\n";
      uStack_90 = 0x21;
    }
  }
  fprintf(pFVar5,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/epoll_server.cpp"
          ,uStack_90,"main",pcVar4);
  fflush(_stderr);
  exit(1);
}

Assistant:

int main()
{
    int sock_fd = socket(AF_INET, SOCK_STREAM, 0);
    if (sock_fd < 0)
    {
        LOG_PRINT("create socket failed! err: %s", strerror(errno));
        exit(EXIT_FAILURE);
    }
    int flags = fcntl(sock_fd, F_GETFL, 0);
    fcntl(sock_fd, F_SETFL, flags | O_NONBLOCK);

    struct sockaddr_in server_addr;
    memset(&server_addr, 0, sizeof(server_addr));
    server_addr.sin_family = AF_INET;
    server_addr.sin_addr.s_addr = INADDR_ANY;
    server_addr.sin_port = htons(ServerPort);

    int ret = bind(sock_fd, (struct sockaddr *)&server_addr, sizeof(server_addr));
    if (ret != 0)
    {
        LOG_PRINT("bind sock failed, err: %s", strerror(errno));
        exit(EXIT_FAILURE);
    }
    ret = listen(sock_fd, MaxFdSize);
    if (ret != 0)
    {
        LOG_PRINT("listen sock failed! err: %s", strerror(errno));
        exit(EXIT_FAILURE);
    }

    Conn conn;
    conn.init(sock_fd, MaxFdSize);
    conn.run();

    close(sock_fd);
    LOG_PRINT("server exit, status: %s", strerror(errno));

    return 0;
}